

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_11::NameApplier::UseNameForParamAndLocalVar
          (NameApplier *this,Func *func,Var *var)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pbVar3;
  pointer pcVar4;
  Index IVar5;
  Index IVar6;
  Enum EVar7;
  int iVar8;
  string_view name_00;
  string name;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  IVar5 = Func::GetLocalIndex(func,var);
  pTVar1 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar6 = LocalTypes::size(&func->local_types);
  EVar7 = Error;
  if (IVar5 < IVar6 + (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3)) {
    pbVar3 = (this->param_and_local_index_to_name_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = pbVar3[IVar5]._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar4,pcVar4 + pbVar3[IVar5]._M_string_length);
    if (var->type_ == Name) {
      if (local_40 != (var->field_2).name_._M_string_length) {
LAB_00116940:
        __assert_fail("name == var->name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/apply-names.cc"
                      ,0xe6,
                      "Result wabt::(anonymous namespace)::NameApplier::UseNameForParamAndLocalVar(Func *, Var *)"
                     );
      }
      if (local_40 != 0) {
        iVar8 = bcmp(local_48,(var->field_2).name_._M_dataplus._M_p,local_40);
        if (iVar8 != 0) goto LAB_00116940;
      }
    }
    else if (local_40 != 0) {
      name_00._M_str = (char *)local_48;
      name_00._M_len = local_40;
      Var::set_name(var,name_00);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result NameApplier::UseNameForParamAndLocalVar(Func* func, Var* var) {
  Index local_index = func->GetLocalIndex(*var);
  if (local_index >= func->GetNumParamsAndLocals()) {
    return Result::Error;
  }

  std::string name = param_and_local_index_to_name_[local_index];
  if (var->is_name()) {
    assert(name == var->name());
    return Result::Ok;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
  return Result::Ok;
}